

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cpp
# Opt level: O2

void __thiscall
cppgenerate::Method::printImplementation(Method *this,Class *parent,ostream *stream,bool inHeader)

{
  ostream *poVar1;
  string parentName;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  local_80 = local_70;
  local_78 = 0;
  local_70[0] = 0;
  if ((1 < (this->m_name)._M_string_length) && (1 < (this->m_returnType)._M_string_length)) {
    if (parent != (Class *)0x0 && !inHeader) {
      Class::getName_abi_cxx11_(&local_40,parent);
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (inHeader) {
      if (this->m_isVirtual == true) {
        std::operator<<(stream,"virtual ");
      }
    }
    else if (this->m_isPureVirtual == false) {
      std::__cxx11::string::string((string *)&local_60,(string *)&local_80);
      printMethodSignature(this,stream,&local_60,false);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if (this->m_isPureVirtual == false) {
      poVar1 = std::operator<<(stream,"{");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = operator<<(stream,&this->m_code);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(stream,"}");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((inHeader) && (this->m_isPureVirtual == true)) {
      poVar1 = std::operator<<(stream," = 0;");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

Method& Method::setPureVirtual( bool isPureVirtual ){
    if( isPureVirtual ){
        m_isVirtual = true;
    }
    m_isPureVirtual = isPureVirtual;

    return *this;
}